

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gears.c
# Opt level: O0

void gear(GLfloat inner_radius,GLfloat outer_radius,GLfloat width,GLint teeth,GLfloat tooth_depth)

{
  PFNGLVERTEX3FPROC p_Var1;
  PFNGLNORMAL3FPROC p_Var2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  GLfloat len;
  GLfloat v;
  GLfloat u;
  GLfloat da;
  GLfloat angle;
  GLfloat r2;
  GLfloat r1;
  GLfloat r0;
  GLint i;
  GLfloat tooth_depth_local;
  GLint teeth_local;
  GLfloat width_local;
  GLfloat outer_radius_local;
  GLfloat inner_radius_local;
  
  fVar3 = outer_radius - tooth_depth / 2.0;
  fVar4 = outer_radius + tooth_depth / 2.0;
  fVar5 = (6.2831855 / (float)teeth) / 4.0;
  (*glad_glShadeModel)(0x1d00);
  (*glad_glNormal3f)(0.0,0.0,1.0);
  (*glad_glBegin)(8);
  for (r1 = 0.0; p_Var1 = glad_glVertex3f, (int)r1 <= teeth; r1 = (GLfloat)((int)r1 + 1)) {
    fVar6 = ((float)(int)r1 * 2.0 * 3.1415927) / (float)teeth;
    dVar9 = cos((double)fVar6);
    dVar10 = sin((double)fVar6);
    (*p_Var1)(inner_radius * (float)dVar9,inner_radius * (float)dVar10,width * 0.5);
    p_Var1 = glad_glVertex3f;
    dVar9 = cos((double)fVar6);
    dVar10 = sin((double)fVar6);
    (*p_Var1)(fVar3 * (float)dVar9,fVar3 * (float)dVar10,width * 0.5);
    p_Var1 = glad_glVertex3f;
    if ((int)r1 < teeth) {
      dVar9 = cos((double)fVar6);
      dVar10 = sin((double)fVar6);
      (*p_Var1)(inner_radius * (float)dVar9,inner_radius * (float)dVar10,width * 0.5);
      p_Var1 = glad_glVertex3f;
      dVar9 = cos((double)(fVar5 * 3.0 + fVar6));
      dVar10 = sin((double)(fVar5 * 3.0 + fVar6));
      (*p_Var1)(fVar3 * (float)dVar9,fVar3 * (float)dVar10,width * 0.5);
    }
  }
  (*glad_glEnd)();
  (*glad_glBegin)(7);
  fVar5 = (6.2831855 / (float)teeth) / 4.0;
  for (r1 = 0.0; p_Var1 = glad_glVertex3f, (int)r1 < teeth; r1 = (GLfloat)((int)r1 + 1)) {
    fVar6 = ((float)(int)r1 * 2.0 * 3.1415927) / (float)teeth;
    dVar9 = cos((double)fVar6);
    dVar10 = sin((double)fVar6);
    (*p_Var1)(fVar3 * (float)dVar9,fVar3 * (float)dVar10,width * 0.5);
    p_Var1 = glad_glVertex3f;
    dVar9 = cos((double)(fVar6 + fVar5));
    dVar10 = sin((double)(fVar6 + fVar5));
    (*p_Var1)(fVar4 * (float)dVar9,fVar4 * (float)dVar10,width * 0.5);
    p_Var1 = glad_glVertex3f;
    dVar9 = cos((double)(fVar5 + fVar5 + fVar6));
    dVar10 = sin((double)(fVar5 + fVar5 + fVar6));
    (*p_Var1)(fVar4 * (float)dVar9,fVar4 * (float)dVar10,width * 0.5);
    p_Var1 = glad_glVertex3f;
    dVar9 = cos((double)(fVar5 * 3.0 + fVar6));
    dVar10 = sin((double)(fVar5 * 3.0 + fVar6));
    (*p_Var1)(fVar3 * (float)dVar9,fVar3 * (float)dVar10,width * 0.5);
  }
  (*glad_glEnd)();
  (*glad_glNormal3f)(0.0,0.0,-1.0);
  (*glad_glBegin)(8);
  for (r1 = 0.0; p_Var1 = glad_glVertex3f, (int)r1 <= teeth; r1 = (GLfloat)((int)r1 + 1)) {
    fVar6 = ((float)(int)r1 * 2.0 * 3.1415927) / (float)teeth;
    dVar9 = cos((double)fVar6);
    dVar10 = sin((double)fVar6);
    (*p_Var1)(fVar3 * (float)dVar9,fVar3 * (float)dVar10,-width * 0.5);
    p_Var1 = glad_glVertex3f;
    dVar9 = cos((double)fVar6);
    dVar10 = sin((double)fVar6);
    (*p_Var1)(inner_radius * (float)dVar9,inner_radius * (float)dVar10,-width * 0.5);
    p_Var1 = glad_glVertex3f;
    if ((int)r1 < teeth) {
      dVar9 = cos((double)(fVar5 * 3.0 + fVar6));
      dVar10 = sin((double)(fVar5 * 3.0 + fVar6));
      (*p_Var1)(fVar3 * (float)dVar9,fVar3 * (float)dVar10,-width * 0.5);
      p_Var1 = glad_glVertex3f;
      dVar9 = cos((double)fVar6);
      dVar10 = sin((double)fVar6);
      (*p_Var1)(inner_radius * (float)dVar9,inner_radius * (float)dVar10,-width * 0.5);
    }
  }
  (*glad_glEnd)();
  (*glad_glBegin)(7);
  fVar5 = (6.2831855 / (float)teeth) / 4.0;
  for (r1 = 0.0; p_Var1 = glad_glVertex3f, (int)r1 < teeth; r1 = (GLfloat)((int)r1 + 1)) {
    fVar6 = ((float)(int)r1 * 2.0 * 3.1415927) / (float)teeth;
    dVar9 = cos((double)(fVar5 * 3.0 + fVar6));
    dVar10 = sin((double)(fVar5 * 3.0 + fVar6));
    (*p_Var1)(fVar3 * (float)dVar9,fVar3 * (float)dVar10,-width * 0.5);
    p_Var1 = glad_glVertex3f;
    dVar9 = cos((double)(fVar5 + fVar5 + fVar6));
    dVar10 = sin((double)(fVar5 + fVar5 + fVar6));
    (*p_Var1)(fVar4 * (float)dVar9,fVar4 * (float)dVar10,-width * 0.5);
    p_Var1 = glad_glVertex3f;
    dVar9 = cos((double)(fVar6 + fVar5));
    dVar10 = sin((double)(fVar6 + fVar5));
    (*p_Var1)(fVar4 * (float)dVar9,fVar4 * (float)dVar10,-width * 0.5);
    p_Var1 = glad_glVertex3f;
    dVar9 = cos((double)fVar6);
    dVar10 = sin((double)fVar6);
    (*p_Var1)(fVar3 * (float)dVar9,fVar3 * (float)dVar10,-width * 0.5);
  }
  (*glad_glEnd)();
  (*glad_glBegin)(8);
  for (r1 = 0.0; p_Var1 = glad_glVertex3f, (int)r1 < teeth; r1 = (GLfloat)((int)r1 + 1)) {
    fVar6 = ((float)(int)r1 * 2.0 * 3.1415927) / (float)teeth;
    dVar9 = cos((double)fVar6);
    dVar10 = sin((double)fVar6);
    (*p_Var1)(fVar3 * (float)dVar9,fVar3 * (float)dVar10,width * 0.5);
    p_Var1 = glad_glVertex3f;
    dVar9 = cos((double)fVar6);
    dVar10 = sin((double)fVar6);
    (*p_Var1)(fVar3 * (float)dVar9,fVar3 * (float)dVar10,-width * 0.5);
    dVar9 = cos((double)(fVar6 + fVar5));
    dVar10 = cos((double)fVar6);
    fVar7 = fVar4 * (float)dVar9 + -(fVar3 * (float)dVar10);
    dVar9 = sin((double)(fVar6 + fVar5));
    dVar10 = sin((double)fVar6);
    fVar8 = fVar4 * (float)dVar9 + -(fVar3 * (float)dVar10);
    dVar9 = sqrt((double)(fVar7 * fVar7 + fVar8 * fVar8));
    (*glad_glNormal3f)(fVar8 / (float)dVar9,-(fVar7 / (float)dVar9),0.0);
    p_Var1 = glad_glVertex3f;
    dVar9 = cos((double)(fVar6 + fVar5));
    dVar10 = sin((double)(fVar6 + fVar5));
    (*p_Var1)(fVar4 * (float)dVar9,fVar4 * (float)dVar10,width * 0.5);
    p_Var1 = glad_glVertex3f;
    dVar9 = cos((double)(fVar6 + fVar5));
    dVar10 = sin((double)(fVar6 + fVar5));
    (*p_Var1)(fVar4 * (float)dVar9,fVar4 * (float)dVar10,-width * 0.5);
    p_Var2 = glad_glNormal3f;
    dVar9 = cos((double)fVar6);
    dVar10 = sin((double)fVar6);
    (*p_Var2)((float)dVar9,(float)dVar10,0.0);
    p_Var1 = glad_glVertex3f;
    dVar9 = cos((double)(fVar5 + fVar5 + fVar6));
    dVar10 = sin((double)(fVar5 + fVar5 + fVar6));
    (*p_Var1)(fVar4 * (float)dVar9,fVar4 * (float)dVar10,width * 0.5);
    p_Var1 = glad_glVertex3f;
    dVar9 = cos((double)(fVar5 + fVar5 + fVar6));
    dVar10 = sin((double)(fVar5 + fVar5 + fVar6));
    (*p_Var1)(fVar4 * (float)dVar9,fVar4 * (float)dVar10,-width * 0.5);
    dVar9 = cos((double)(fVar5 * 3.0 + fVar6));
    dVar10 = cos((double)(fVar5 + fVar5 + fVar6));
    dVar11 = sin((double)(fVar5 * 3.0 + fVar6));
    dVar12 = sin((double)(fVar5 + fVar5 + fVar6));
    (*glad_glNormal3f)(fVar3 * (float)dVar11 + -(fVar4 * (float)dVar12),
                       -(fVar3 * (float)dVar9 + -(fVar4 * (float)dVar10)),0.0);
    p_Var1 = glad_glVertex3f;
    dVar9 = cos((double)(fVar5 * 3.0 + fVar6));
    dVar10 = sin((double)(fVar5 * 3.0 + fVar6));
    (*p_Var1)(fVar3 * (float)dVar9,fVar3 * (float)dVar10,width * 0.5);
    p_Var1 = glad_glVertex3f;
    dVar9 = cos((double)(fVar5 * 3.0 + fVar6));
    dVar10 = sin((double)(fVar5 * 3.0 + fVar6));
    (*p_Var1)(fVar3 * (float)dVar9,fVar3 * (float)dVar10,-width * 0.5);
    p_Var2 = glad_glNormal3f;
    dVar9 = cos((double)fVar6);
    dVar10 = sin((double)fVar6);
    (*p_Var2)((float)dVar9,(float)dVar10,0.0);
  }
  dVar9 = cos(0.0);
  dVar10 = sin(0.0);
  (*p_Var1)(fVar3 * (float)dVar9,fVar3 * (float)dVar10,width * 0.5);
  p_Var1 = glad_glVertex3f;
  dVar9 = cos(0.0);
  dVar10 = sin(0.0);
  (*p_Var1)(fVar3 * (float)dVar9,fVar3 * (float)dVar10,-width * 0.5);
  (*glad_glEnd)();
  (*glad_glShadeModel)(0x1d01);
  (*glad_glBegin)(8);
  for (r1 = 0.0; p_Var2 = glad_glNormal3f, (int)r1 <= teeth; r1 = (GLfloat)((int)r1 + 1)) {
    fVar3 = ((float)(int)r1 * 2.0 * 3.1415927) / (float)teeth;
    dVar9 = cos((double)fVar3);
    dVar10 = sin((double)fVar3);
    (*p_Var2)(-(float)dVar9,-(float)dVar10,0.0);
    p_Var1 = glad_glVertex3f;
    dVar9 = cos((double)fVar3);
    dVar10 = sin((double)fVar3);
    (*p_Var1)(inner_radius * (float)dVar9,inner_radius * (float)dVar10,-width * 0.5);
    p_Var1 = glad_glVertex3f;
    dVar9 = cos((double)fVar3);
    dVar10 = sin((double)fVar3);
    (*p_Var1)(inner_radius * (float)dVar9,inner_radius * (float)dVar10,width * 0.5);
  }
  (*glad_glEnd)();
  return;
}

Assistant:

static void
gear(GLfloat inner_radius, GLfloat outer_radius, GLfloat width,
  GLint teeth, GLfloat tooth_depth)
{
  GLint i;
  GLfloat r0, r1, r2;
  GLfloat angle, da;
  GLfloat u, v, len;

  r0 = inner_radius;
  r1 = outer_radius - tooth_depth / 2.f;
  r2 = outer_radius + tooth_depth / 2.f;

  da = 2.f * (float) M_PI / teeth / 4.f;

  glShadeModel(GL_FLAT);

  glNormal3f(0.f, 0.f, 1.f);

  /* draw front face */
  glBegin(GL_QUAD_STRIP);
  for (i = 0; i <= teeth; i++) {
    angle = i * 2.f * (float) M_PI / teeth;
    glVertex3f(r0 * (float) cos(angle), r0 * (float) sin(angle), width * 0.5f);
    glVertex3f(r1 * (float) cos(angle), r1 * (float) sin(angle), width * 0.5f);
    if (i < teeth) {
      glVertex3f(r0 * (float) cos(angle), r0 * (float) sin(angle), width * 0.5f);
      glVertex3f(r1 * (float) cos(angle + 3 * da), r1 * (float) sin(angle + 3 * da), width * 0.5f);
    }
  }
  glEnd();

  /* draw front sides of teeth */
  glBegin(GL_QUADS);
  da = 2.f * (float) M_PI / teeth / 4.f;
  for (i = 0; i < teeth; i++) {
    angle = i * 2.f * (float) M_PI / teeth;

    glVertex3f(r1 * (float) cos(angle), r1 * (float) sin(angle), width * 0.5f);
    glVertex3f(r2 * (float) cos(angle + da), r2 * (float) sin(angle + da), width * 0.5f);
    glVertex3f(r2 * (float) cos(angle + 2 * da), r2 * (float) sin(angle + 2 * da), width * 0.5f);
    glVertex3f(r1 * (float) cos(angle + 3 * da), r1 * (float) sin(angle + 3 * da), width * 0.5f);
  }
  glEnd();

  glNormal3f(0.0, 0.0, -1.0);

  /* draw back face */
  glBegin(GL_QUAD_STRIP);
  for (i = 0; i <= teeth; i++) {
    angle = i * 2.f * (float) M_PI / teeth;
    glVertex3f(r1 * (float) cos(angle), r1 * (float) sin(angle), -width * 0.5f);
    glVertex3f(r0 * (float) cos(angle), r0 * (float) sin(angle), -width * 0.5f);
    if (i < teeth) {
      glVertex3f(r1 * (float) cos(angle + 3 * da), r1 * (float) sin(angle + 3 * da), -width * 0.5f);
      glVertex3f(r0 * (float) cos(angle), r0 * (float) sin(angle), -width * 0.5f);
    }
  }
  glEnd();

  /* draw back sides of teeth */
  glBegin(GL_QUADS);
  da = 2.f * (float) M_PI / teeth / 4.f;
  for (i = 0; i < teeth; i++) {
    angle = i * 2.f * (float) M_PI / teeth;

    glVertex3f(r1 * (float) cos(angle + 3 * da), r1 * (float) sin(angle + 3 * da), -width * 0.5f);
    glVertex3f(r2 * (float) cos(angle + 2 * da), r2 * (float) sin(angle + 2 * da), -width * 0.5f);
    glVertex3f(r2 * (float) cos(angle + da), r2 * (float) sin(angle + da), -width * 0.5f);
    glVertex3f(r1 * (float) cos(angle), r1 * (float) sin(angle), -width * 0.5f);
  }
  glEnd();

  /* draw outward faces of teeth */
  glBegin(GL_QUAD_STRIP);
  for (i = 0; i < teeth; i++) {
    angle = i * 2.f * (float) M_PI / teeth;

    glVertex3f(r1 * (float) cos(angle), r1 * (float) sin(angle), width * 0.5f);
    glVertex3f(r1 * (float) cos(angle), r1 * (float) sin(angle), -width * 0.5f);
    u = r2 * (float) cos(angle + da) - r1 * (float) cos(angle);
    v = r2 * (float) sin(angle + da) - r1 * (float) sin(angle);
    len = (float) sqrt(u * u + v * v);
    u /= len;
    v /= len;
    glNormal3f(v, -u, 0.0);
    glVertex3f(r2 * (float) cos(angle + da), r2 * (float) sin(angle + da), width * 0.5f);
    glVertex3f(r2 * (float) cos(angle + da), r2 * (float) sin(angle + da), -width * 0.5f);
    glNormal3f((float) cos(angle), (float) sin(angle), 0.f);
    glVertex3f(r2 * (float) cos(angle + 2 * da), r2 * (float) sin(angle + 2 * da), width * 0.5f);
    glVertex3f(r2 * (float) cos(angle + 2 * da), r2 * (float) sin(angle + 2 * da), -width * 0.5f);
    u = r1 * (float) cos(angle + 3 * da) - r2 * (float) cos(angle + 2 * da);
    v = r1 * (float) sin(angle + 3 * da) - r2 * (float) sin(angle + 2 * da);
    glNormal3f(v, -u, 0.f);
    glVertex3f(r1 * (float) cos(angle + 3 * da), r1 * (float) sin(angle + 3 * da), width * 0.5f);
    glVertex3f(r1 * (float) cos(angle + 3 * da), r1 * (float) sin(angle + 3 * da), -width * 0.5f);
    glNormal3f((float) cos(angle), (float) sin(angle), 0.f);
  }

  glVertex3f(r1 * (float) cos(0), r1 * (float) sin(0), width * 0.5f);
  glVertex3f(r1 * (float) cos(0), r1 * (float) sin(0), -width * 0.5f);

  glEnd();

  glShadeModel(GL_SMOOTH);

  /* draw inside radius cylinder */
  glBegin(GL_QUAD_STRIP);
  for (i = 0; i <= teeth; i++) {
    angle = i * 2.f * (float) M_PI / teeth;
    glNormal3f(-(float) cos(angle), -(float) sin(angle), 0.f);
    glVertex3f(r0 * (float) cos(angle), r0 * (float) sin(angle), -width * 0.5f);
    glVertex3f(r0 * (float) cos(angle), r0 * (float) sin(angle), width * 0.5f);
  }
  glEnd();

}